

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-item-wear.c
# Opt level: O1

_Bool borg_wear_rings(void)

{
  ushort uVar1;
  int iVar2;
  bool bVar3;
  wchar_t wVar4;
  int32_t iVar5;
  char *what;
  ulong uVar6;
  uint uVar7;
  borg_item_conflict *pbVar8;
  ulong uVar9;
  int iVar10;
  long lVar11;
  
  wVar4 = borg_first_empty_inventory_slot();
  if (wVar4 != L'\xffffffff') {
    uVar1 = z_info->pack_size;
    if ((((borg_items[(ulong)uVar1 + 3].iqty == '\0') && (borg_items[(ulong)uVar1 + 2].iqty == '\0')
         ) && (wVar4 + L'\x01' < (int)((uint)uVar1 - borg.trait[0x9e]))) &&
       (((borg_items[wVar4 + L'\x01'].iqty == '\0' && (borg.trait[0x6d] == 0)) &&
        (borg.trait[0x6c] == 0)))) {
      iVar10 = 0;
      if (2000 < borg_t - borg_began) {
        return false;
      }
      uVar6 = (ulong)z_info->pack_size;
      if (z_info->pack_size == 0) {
        uVar7 = 0xffffffff;
        bVar3 = false;
      }
      else {
        uVar9 = 0;
        uVar7 = 0xffffffff;
        lVar11 = 0x84;
        bVar3 = false;
        iVar10 = 0;
        do {
          pbVar8 = borg_items;
          if (((borg_items->desc[lVar11 + -0x20] != '\0') &&
              (borg_items->desc[lVar11 + -0x26] == '\x01')) &&
             (((*(int *)(borg_items->desc + lVar11) != 0 &&
               ((((player->opts).opt[0x1e] != true || (borg_items->desc[lVar11 + -0x28] != '\0')) ||
                (borg_items->desc[lVar11 + -0x1c] == '\0')))) &&
              (borg_items->desc[lVar11 + -0x24] == '\x15')))) {
            memcpy(borg_items + uVar6 + 3,(void *)((long)borg_items + lVar11 + -0x84),0x388);
            borg_items[(ulong)z_info->pack_size + 3].iqty = '\x01';
            pbVar8->desc[lVar11 + -0x20] = pbVar8->desc[lVar11 + -0x20] + -1;
            borg_notice(true);
            iVar5 = borg_power();
            iVar2 = borg.power * 2;
            if (pbVar8->desc[lVar11 + -0x14] == '\0') {
              iVar2 = iVar5;
            }
            borg_items[(ulong)z_info->pack_size + 3].iqty = '\0';
            pbVar8->desc[lVar11 + -0x20] = pbVar8->desc[lVar11 + -0x20] + '\x01';
            bVar3 = iVar10 <= iVar2;
            if ((int)uVar7 < 0 || bVar3) {
              iVar10 = iVar2;
            }
            if ((int)uVar7 < 0 || bVar3) {
              uVar7 = (uint)uVar9;
            }
            bVar3 = true;
          }
          uVar9 = uVar9 + 1;
          uVar6 = (ulong)z_info->pack_size;
          lVar11 = lVar11 + 0x388;
        } while (uVar9 < uVar6);
      }
      if (bVar3) {
        borg_notice(true);
      }
      if ((int)uVar7 < 0) {
        return false;
      }
      if (iVar10 <= borg.power) {
        return false;
      }
      pbVar8 = borg_items + uVar7;
      borg_note("# Putting on best tight ring.");
      what = format("# Wearing %s.",pbVar8);
      borg_note(what);
      borg_keypress(0x77);
      borg_keypress((int)"abcdefgimnopqrstuvwxyzABCDEFGHIJKLMNOPQRSTUVWXYZ"[uVar7]);
      borg.time_this_panel = borg.time_this_panel + 1;
      return true;
    }
  }
  return false;
}

Assistant:

bool borg_wear_rings(void)
{
    int hole = borg_first_empty_inventory_slot();

    int32_t p, b_p = 0L;

    int i, b_i     = -1;

    borg_item *item;

    bool fix = false;

    if (hole == -1)
        return false;

    /* Require no rings */
    if (borg_items[INVEN_LEFT].iqty)
        return false;
    if (borg_items[INVEN_RIGHT].iqty)
        return false;

    /* Require two empty slots */
    if (hole + 1 >= PACK_SLOTS)
        return false;
    if (borg_items[hole + 1].iqty)
        return false;

    /* hack prevent the swap till you drop loop */
    if (borg.trait[BI_ISHUNGRY] || borg.trait[BI_ISWEAK])
        return false;

    /* Forbid if been sitting on level forever */
    /*    Just come back and work through the loop later */
    if (borg_t - borg_began > 2000)
        return false;

    /* Scan inventory */
    for (i = 0; i < z_info->pack_size; i++) {
        item = &borg_items[i];

        /* Skip empty items */
        if (!item->iqty)
            continue;

        /* Require aware */
        if (!item->aware)
            continue;

        /* Hack -- ignore "worthless" items */
        if (!item->value)
            continue;

        /* skip artifact rings not star id'd  */
        if (OPT(player, birth_randarts) && !item->ident && item->art_idx)
            continue;

        /* Only process "rings" */
        if (item->tval != TV_RING)
            continue;

        /* Wear new item */
        memcpy(&borg_items[INVEN_LEFT], item, sizeof(borg_item));

        /* Only a single item */
        borg_items[INVEN_LEFT].iqty = 1;

        /* Reduce the inventory quantity by one */
        item->iqty--;

        /* Fix later */
        fix = true;

        /* Examine the inventory */
        borg_notice(true);

        /* Evaluate the inventory */
        p = borg_power();

        /* the One Ring would be awesome */
        if (item->one_ring)
            p = borg.power * 2;

        /* Restore the old item (empty) */
        borg_items[INVEN_LEFT].iqty = 0;

        /* Restore the item in inventory */
        item->iqty++;

        /* Ignore "bad" swaps */
        if ((b_i >= 0) && (p < b_p))
            continue;

        /* Maintain the "best" */
        b_i = i;
        b_p = p;
    }

    /* Restore bonuses */
    if (fix)
        borg_notice(true);

    /* No item */
    if ((b_i >= 0) && (b_p > borg.power)) {
        /* Get the item */
        item = &borg_items[b_i];

        /* Log */
        borg_note("# Putting on best tight ring.");

        /* Log */
        borg_note(format("# Wearing %s.", item->desc));

        /* Wear it */
        borg_keypress('w');
        borg_keypress(all_letters_nohjkl[b_i]);

        /* Did something */
        borg.time_this_panel++;
        return true;
    }

    /* Nope */
    return false;
}